

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_hash.c
# Opt level: O0

void adt_hnode_insert(adt_hnode_t *node,adt_hkey_t *key,uint32_t u32Hash)

{
  adt_hmatch_t *__ptr;
  undefined4 uVar1;
  adt_hmatch_t *paVar2;
  byte bVar3;
  adt_hmatch_t *paVar4;
  uint8_t u8Bucket_1;
  uint32_t u32Bits_1;
  adt_hmatch_t *old;
  adt_hkey_t *hkey;
  uint8_t u8Bucket;
  uint32_t u32Bits;
  uint8_t i;
  uint32_t u32Hash_local;
  adt_hkey_t *key_local;
  adt_hnode_t *node_local;
  
  if (node == (adt_hnode_t *)0x0) {
    __assert_fail("node",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/adt/src/adt_hash.c"
                  ,0x14b,"void adt_hnode_insert(adt_hnode_t *, adt_hkey_t *, uint32_t)");
  }
  if (key == (adt_hkey_t *)0x0) {
    __assert_fail("key",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/adt/src/adt_hash.c"
                  ,0x14c,"void adt_hnode_insert(adt_hnode_t *, adt_hkey_t *, uint32_t)");
  }
  if (node->u8Width == '\x10') {
    adt_hnode_insert((adt_hnode_t *)
                     ((node->child).match + ((byte)(u32Hash >> ((node->u8Depth & 7) << 2)) & 0xf)),
                     key,u32Hash);
  }
  else {
    for (u8Bucket = '\0'; u8Bucket < node->u8Cur; u8Bucket = u8Bucket + '\x01') {
      if ((node->child).match[u8Bucket].u32Hash == u32Hash) {
        old = (adt_hmatch_t *)(node->child).match[u8Bucket].key;
        if ((adt_hkey_t *)old != (adt_hkey_t *)0x0) {
          for (; *(long *)(old + 1) != 0; old = *(adt_hmatch_t **)(old + 1)) {
          }
          *(adt_hkey_t **)(old + 1) = key;
          return;
        }
        __assert_fail("hkey != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/adt/src/adt_hash.c"
                      ,0x156,"void adt_hnode_insert(adt_hnode_t *, adt_hkey_t *, uint32_t)");
      }
    }
    if (node->u8Cur < node->u8Width) {
      (node->child).match[node->u8Cur].key = key;
      bVar3 = node->u8Cur;
      node->u8Cur = bVar3 + 1;
      (node->child).match[bVar3].u32Hash = u32Hash;
    }
    else {
      __ptr = (node->child).match;
      node->u8Width = node->u8Width << 1;
      if (node->u8Width < 0x10) {
        paVar2 = (adt_hmatch_t *)malloc((ulong)node->u8Width << 4);
        (node->child).match = paVar2;
        if ((node->child).match == (adt_hmatch_t *)0x0) {
          __assert_fail("node->child.match",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/adt/src/adt_hash.c"
                        ,0x167,"void adt_hnode_insert(adt_hnode_t *, adt_hkey_t *, uint32_t)");
        }
        for (u8Bucket = '\0'; u8Bucket < node->u8Cur; u8Bucket = u8Bucket + '\x01') {
          paVar2 = (node->child).match + u8Bucket;
          paVar4 = __ptr + u8Bucket;
          uVar1 = *(undefined4 *)&paVar4->field_0x4;
          paVar2->u32Hash = paVar4->u32Hash;
          *(undefined4 *)&paVar2->field_0x4 = uVar1;
          paVar2->key = paVar4->key;
        }
        free(__ptr);
        (node->child).match[node->u8Cur].key = key;
        bVar3 = node->u8Cur;
        node->u8Cur = bVar3 + 1;
        (node->child).match[bVar3].u32Hash = u32Hash;
      }
      else {
        if (node->u8Width != '\x10') {
          __assert_fail("node->u8Width==16",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/adt/src/adt_hash.c"
                        ,0x172,"void adt_hnode_insert(adt_hnode_t *, adt_hkey_t *, uint32_t)");
        }
        paVar2 = (adt_hmatch_t *)malloc(0x100);
        (node->child).match = paVar2;
        if ((node->child).match == (adt_hmatch_t *)0x0) {
          __assert_fail("node->child.node",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/adt/src/adt_hash.c"
                        ,0x174,"void adt_hnode_insert(adt_hnode_t *, adt_hkey_t *, uint32_t)");
        }
        for (u8Bucket = '\0'; u8Bucket < 0x10; u8Bucket = u8Bucket + '\x01') {
          adt_hnode_create((adt_hnode_t *)((node->child).match + u8Bucket));
          *(uint8_t *)((long)&(node->child).match[u8Bucket].u32Hash + 2) = node->u8Depth + '\x01';
        }
        if (8 < node->u8Depth) {
          __assert_fail("node->u8Depth<=8",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/adt/src/adt_hash.c"
                        ,0x179,"void adt_hnode_insert(adt_hnode_t *, adt_hkey_t *, uint32_t)");
        }
        bVar3 = node->u8Depth << 2;
        for (u8Bucket = '\0'; u8Bucket < node->u8Cur; u8Bucket = u8Bucket + '\x01') {
          adt_hnode_insert((adt_hnode_t *)
                           ((node->child).match +
                           ((byte)(__ptr[u8Bucket].u32Hash >> (bVar3 & 0x1f)) & 0xf)),
                           __ptr[u8Bucket].key,__ptr[u8Bucket].u32Hash);
        }
        free(__ptr);
        adt_hnode_insert((adt_hnode_t *)
                         ((node->child).match + ((byte)(u32Hash >> (bVar3 & 0x1f)) & 0xf)),key,
                         u32Hash);
      }
    }
  }
  return;
}

Assistant:

void adt_hnode_insert(adt_hnode_t *node, adt_hkey_t *key, uint32_t u32Hash){
	uint8_t i;
	assert(node);
	assert(key);
	if(node->u8Width == 16){
		uint32_t u32Bits = (node->u8Depth)*4;
		uint8_t u8Bucket = (uint8_t) ((u32Hash >> u32Bits) & 0xF);
		adt_hnode_insert(&node->child.node[u8Bucket],key,u32Hash);
	}
	else{
		for(i=0;i<node->u8Cur;i++){
			if(node->child.match[i].u32Hash == u32Hash){
				adt_hkey_t *hkey = node->child.match[i].key;
				assert(hkey != 0);
				while(hkey->next){
					hkey = hkey->next;
				}
				hkey->next = key;
				return;
			}
		}
		if(node->u8Cur < node->u8Width){
			node->child.match[node->u8Cur].key = key;
			node->child.match[node->u8Cur++].u32Hash = u32Hash;
		}
		else{
			adt_hmatch_t* old = node->child.match;
			node->u8Width *= 2;
			if(node->u8Width<16){
				node->child.match = (adt_hmatch_t*) malloc(sizeof(adt_hmatch_t)*node->u8Width);
				assert(node->child.match);
				for(i=0;i<node->u8Cur;i++){
					node->child.match[i]=old[i];
				}
				free(old);
				node->child.match[node->u8Cur].key = key;
				node->child.match[node->u8Cur++].u32Hash = u32Hash;
			}
			else{
            uint32_t u32Bits;
            uint8_t u8Bucket;
				assert(node->u8Width==16);
				node->child.node = (adt_hnode_t*) malloc(sizeof(adt_hnode_t)*16);
				assert(node->child.node);
				for(i=0;i<16;i++){
					adt_hnode_create(&node->child.node[i]);
					node->child.node[i].u8Depth = node->u8Depth+1;
				}
				assert(node->u8Depth<=8);
            u32Bits = (node->u8Depth)*4;
				for(i=0;i<node->u8Cur;i++){
					u8Bucket = (uint8_t) ( (old[i].u32Hash >> u32Bits) & 0xF);
					adt_hnode_insert(&node->child.node[u8Bucket],old[i].key,old[i].u32Hash);
				}
				free(old);
            u8Bucket = (uint8_t) ((u32Hash >> u32Bits) & 0xF);
				adt_hnode_insert(&node->child.node[u8Bucket],key,u32Hash);
			}
		}
	}
}